

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
               (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                begin,__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      end,random_engine *rng,double min,double max)

{
  bool bVar1;
  pointer ppVar2;
  result_type rVar3;
  undefined1 local_40 [8];
  uniform_real_distribution<double> distribution;
  double max_local;
  double min_local;
  random_engine *rng_local;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin_local;
  
  distribution._M_param._M_b = max;
  rng_local = (random_engine *)end._M_current;
  end_local = begin;
  if (min == max) {
    details::fail_fast("Precondition","min != max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                       ,"954");
  }
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_40,min,max);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      (&end_local,
                       (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                        *)&rng_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_40,rng);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator->(&end_local);
    ppVar2->first = rVar3;
    __gnu_cxx::
    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
    ::operator++(&end_local);
  }
  return;
}

Assistant:

inline void
random_epsilon_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng,
                      floatingpointT min,
                      floatingpointT max)
{
    bx_expects(min != max);

    std::uniform_real_distribution<floatingpointT> distribution(min, max);

    for (; begin != end; ++begin)
        begin->first = distribution(rng);
}